

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O2

float __thiscall Imath_3_2::Vec3<float>::length(Vec3<float> *this)

{
  float fVar1;
  
  fVar1 = dot(this,this);
  if (fVar1 < 2.3509887e-38) {
    fVar1 = lengthTiny(this);
    return fVar1;
  }
  if (0.0 <= fVar1) {
    return SQRT(fVar1);
  }
  fVar1 = sqrtf(fVar1);
  return fVar1;
}

Assistant:

IMATH_HOSTDEVICE inline T
Vec3<T>::length () const IMATH_NOEXCEPT
{
    T length2 = dot (*this);

    if (IMATH_UNLIKELY (length2 < T (2) * std::numeric_limits<T>::min ()))
        return lengthTiny ();

    return std::sqrt (length2);
}